

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O3

void m_dowear_type(level *lev,monst *mon,long flag,boolean creation,boolean racialexception)

{
  uint uVar1;
  obj *poVar2;
  obj **ppoVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  byte bVar12;
  uchar uVar13;
  obj *otmp;
  obj *obj;
  obj *obj_00;
  uint uVar14;
  char buf [256];
  char nambuf [256];
  char local_238 [256];
  char local_138 [264];
  
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_0028cf79;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028cf0c;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028cf07;
    }
    else {
LAB_0028cf07:
      if (ublindf == (obj *)0x0) goto LAB_0028cebf;
LAB_0028cf0c:
      uVar14 = 1;
      if (ublindf->oartifact != '\x1d') goto LAB_0028cfd8;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (uVar14 = 1, ((youmonst.data)->mflags3 & 0x100) != 0)) &&
        (uVar14 = 1, (viz_array[mon->my][mon->mx] & 1U) != 0)) &&
       ((mon->data->mflags3 & 0x200) != 0)) goto LAB_0028cf79;
  }
  else {
    bVar4 = worm_known(lev,mon);
    if (bVar4 == '\0') {
LAB_0028cebf:
      uVar14 = 1;
    }
    else {
LAB_0028cf79:
      uVar9 = *(uint *)&mon->field_0x60;
      if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        uVar14 = 1;
        if (-1 < (char)uVar9) goto LAB_0028cfc4;
      }
      else {
        uVar14 = 1;
        if ((-1 < (char)uVar9) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028cfc4:
          uVar14 = 1;
          if ((uVar9 >> 9 & 1) == 0) {
            uVar14 = (uint)u._1052_4_ >> 5 & 1;
          }
        }
      }
    }
  }
LAB_0028cfd8:
  if (mon->mfrozen != '\0') {
    return;
  }
  if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
     (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
    pcVar10 = mon_nam(mon);
  }
  else {
    pcVar10 = Monnam(mon);
  }
  strcpy(local_138,pcVar10);
  obj_00 = (obj *)&mon->minvent;
  do {
    obj_00 = obj_00->nobj;
    if (obj_00 == (obj *)0x0) goto LAB_0028d067;
  } while ((obj_00->owornmask & flag) == 0);
  if (flag == 0x10000) {
    return;
  }
  if ((*(uint *)&obj_00->field_0x4a & 1) != 0) {
    return;
  }
LAB_0028d067:
  poVar2 = mon->minvent;
  otmp = obj_00;
  if (poVar2 == (obj *)0x0) {
    return;
  }
  do {
    obj = poVar2;
    if (flag < 0x10) {
      switch(flag) {
      case 1:
        if ((obj->oclass != '\x03') ||
           ((objects[obj->otyp].oc_subtyp != '\0' ||
            ((racialexception != '\0' && (iVar5 = racial_exception(mon,obj), iVar5 == 0))))))
        goto LAB_0028d313;
        break;
      case 2:
        if ((obj->oclass != '\x03') || (objects[obj->otyp].oc_subtyp != '\x05')) goto LAB_0028d313;
        break;
      case 4:
        if (((obj->oclass != '\x03') || (objects[obj->otyp].oc_subtyp != '\x02')) ||
           (((iVar5 = num_horns(mon->data), 0 < iVar5 && ((long)obj->otyp != 0x3d)) &&
            ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x180) != 0)))) goto LAB_0028d313;
        break;
      case 8:
        if ((obj->oclass != '\x03') || (objects[obj->otyp].oc_subtyp != '\x01')) goto LAB_0028d313;
      }
switchD_0028d0ae_caseD_3:
      if (obj->owornmask == 0) {
        if (otmp != (obj *)0x0) {
          iVar5 = arm_bonus(otmp,mon);
          iVar6 = extra_pref(mon,otmp);
          iVar7 = arm_bonus(obj,mon);
          iVar8 = extra_pref(mon,obj);
          if (iVar8 + iVar7 <= iVar6 + iVar5) goto LAB_0028d313;
        }
        otmp = obj;
      }
    }
    else if (flag < 0x40) {
      if (flag == 0x10) {
        if ((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x03'))
        goto switchD_0028d0ae_caseD_3;
      }
      else if ((flag != 0x20) ||
              ((obj->oclass == '\x03' && (objects[obj->otyp].oc_subtyp == '\x04'))))
      goto switchD_0028d0ae_caseD_3;
    }
    else if (flag == 0x40) {
      if ((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x06'))
      goto switchD_0028d0ae_caseD_3;
    }
    else {
      if (flag != 0x10000) goto switchD_0028d0ae_caseD_3;
      if ((obj->oclass == '\x05') &&
         (((obj->otyp == 0xca || (obj->otyp == 0xd0)) || ((obj->oprops & 0x10) != 0)))) break;
    }
LAB_0028d313:
    ppoVar3 = &obj->nobj;
    obj = otmp;
    poVar2 = *ppoVar3;
  } while (*ppoVar3 != (obj *)0x0);
  if (obj == obj_00 || obj == (obj *)0x0) {
    return;
  }
  if ((flag == 0x40) || (bVar12 = 0, flag == 1)) {
    bVar12 = (byte)mon->misc_worn_check & 2;
  }
  if (obj_00 != (obj *)0x0) {
    bVar12 = bVar12 + objects[obj_00->otyp].oc_delay;
    obj_00->owornmask = 0;
  }
  if (creation == '\0') {
    if (mon->wormno == '\0') {
      if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_0028d45b;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028d3ed;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028d3e4;
      }
      else {
LAB_0028d3e4:
        if (ublindf == (obj *)0x0) goto LAB_0028d535;
LAB_0028d3ed:
        if (ublindf->oartifact != '\x1d') goto LAB_0028d535;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mon->my][mon->mx] & 1U) != 0))
         && ((mon->data->mflags3 & 0x200) != 0)) goto LAB_0028d45b;
    }
    else {
      bVar4 = worm_known(lev,mon);
      if (bVar4 != '\0') {
LAB_0028d45b:
        uVar9 = *(uint *)&mon->field_0x60;
        if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar9 & 0x280) == 0) goto LAB_0028d4b2;
        }
        else if (((uVar9 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028d4b2:
          if ((u._1052_4_ & 0x20) == 0) {
            if (obj_00 == (obj *)0x0) {
              local_238[0] = '\0';
            }
            else {
              pcVar10 = distant_name(obj_00,doname);
              sprintf(local_238," removes %s and",pcVar10);
            }
            pcVar10 = Monnam(mon);
            pcVar11 = distant_name(obj,doname);
            pline("%s%s puts on %s.",pcVar10,local_238,pcVar11);
          }
        }
      }
    }
LAB_0028d535:
    uVar13 = bVar12 + objects[obj->otyp].oc_delay;
    mon->mfrozen = uVar13;
    if (uVar13 != '\0') {
      mon->field_0x62 = mon->field_0x62 & 0xfb;
    }
  }
  if (obj_00 != (obj *)0x0) {
    update_mon_intrinsics(lev,mon,obj_00,'\0',creation);
  }
  mon->misc_worn_check = mon->misc_worn_check | (uint)flag;
  obj->owornmask = obj->owornmask | (uint)flag;
  update_mon_intrinsics(lev,mon,obj,'\x01',creation);
  if (creation != '\0') {
    return;
  }
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028d607;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028d602;
      }
      else {
LAB_0028d602:
        if (ublindf == (obj *)0x0) goto LAB_0028d5ba;
LAB_0028d607:
        uVar9 = 1;
        if (ublindf->oartifact != '\x1d') goto LAB_0028d6f2;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (uVar9 = 1, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
          (uVar9 = 1, (viz_array[mon->my][mon->mx] & 1U) == 0)) ||
         ((mon->data->mflags3 & 0x200) == 0)) goto LAB_0028d6f2;
    }
  }
  else {
    bVar4 = worm_known(lev,mon);
    if (bVar4 == '\0') {
LAB_0028d5ba:
      uVar9 = 1;
      goto LAB_0028d6f2;
    }
  }
  uVar1 = *(uint *)&mon->field_0x60;
  if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    uVar9 = 1;
    if ((char)uVar1 < '\0') goto LAB_0028d6f2;
  }
  else {
    uVar9 = 1;
    if (((char)uVar1 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0)) goto LAB_0028d6f2;
  }
  uVar9 = 1;
  if ((uVar1 >> 9 & 1) == 0) {
    uVar9 = (uint)u._1052_4_ >> 5 & 1;
  }
LAB_0028d6f2:
  if ((((uVar14 != uVar9) && ((mon->field_0x60 & 2) != 0)) && (u.uprops[0xc].intrinsic == 0)) &&
     ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
    pline("Suddenly you cannot see %s.",local_138);
    discover_object((int)obj->otyp,'\x01','\x01');
  }
  return;
}

Assistant:

static void m_dowear_type(struct level *lev, struct monst *mon, long flag,
			  boolean creation, boolean racialexception)
{
	struct obj *old, *best, *obj;
	int m_delay = 0;
	int unseen = !canseemon(lev, mon);
	char nambuf[BUFSZ];

	if (mon->mfrozen) return; /* probably putting previous item on */

	/* Get a copy of monster's name before altering its visibility */
	strcpy(nambuf, See_invisible ? Monnam(mon) : mon_nam(mon));

	old = which_armor(mon, flag);
	if (old && old->cursed) return;
	if (old && flag == W_AMUL) return; /* no such thing as better amulets */
	best = old;

	for (obj = mon->minvent; obj; obj = obj->nobj) {
	    switch(flag) {
		case W_AMUL:
		    if (obj->oclass != AMULET_CLASS ||
			    (obj->otyp != AMULET_OF_LIFE_SAVING &&
				obj->otyp != AMULET_OF_REFLECTION &&
				!(obj->oprops & ITEM_REFLECTION)))
			continue;
		    best = obj;
		    goto outer_break; /* no such thing as better amulets */
		case W_ARMU:
		    if (!is_shirt(obj)) continue;
		    break;
		case W_ARMC:
		    if (!is_cloak(obj)) continue;
		    break;
		case W_ARMH:
		    if (!is_helmet(obj)) continue;
		    /* (flimsy exception matches polyself handling) */
		    if (has_horns(mon->data) && !is_flimsy(obj)) continue;
		    break;
		case W_ARMS:
		    if (!is_shield(obj)) continue;
		    break;
		case W_ARMG:
		    if (!is_gloves(obj)) continue;
		    break;
		case W_ARMF:
		    if (!is_boots(obj)) continue;
		    break;
		case W_ARM:
		    if (!is_suit(obj)) continue;
		    if (racialexception && (racial_exception(mon, obj) < 1)) continue;
		    break;
	    }
	    if (obj->owornmask) continue;
	    /* I'd like to define a VISIBLE_ARM_BONUS which doesn't assume the
	     * monster knows obj->spe, but if I did that, a monster would keep
	     * switching forever between two -2 caps since when it took off one
	     * it would forget spe and once again think the object is better
	     * than what it already has.
	     */
	    if (best && (arm_bonus(best, mon) + extra_pref(mon, best) >=
			 arm_bonus(obj, mon) + extra_pref(mon, obj)))
		continue;
	    best = obj;
	}
outer_break:
	if (!best || best == old) return;

	/* if wearing a cloak, account for the time spent removing
	   and re-wearing it when putting on a suit or shirt */
	if ((flag == W_ARM || flag == W_ARMU) && (mon->misc_worn_check & W_ARMC))
	    m_delay += 2;
	/* when upgrading a piece of armor, account for time spent
	   taking off current one */
	if (old)
	    m_delay += objects[old->otyp].oc_delay;

	if (old) /* do this first to avoid "(being worn)" */
	    old->owornmask = 0L;
	if (!creation) {
	    if (canseemon(lev, mon)) {
		char buf[BUFSZ];

		if (old)
		    sprintf(buf, " removes %s and", distant_name(old, doname));
		else
		    buf[0] = '\0';
		pline("%s%s puts on %s.", Monnam(mon),
		      buf, distant_name(best,doname));
	    } /* can see it */
	    m_delay += objects[best->otyp].oc_delay;
	    mon->mfrozen = m_delay;
	    if (mon->mfrozen) mon->mcanmove = 0;
	}
	if (old)
	    update_mon_intrinsics(lev, mon, old, FALSE, creation);
	mon->misc_worn_check |= flag;
	best->owornmask |= flag;
	update_mon_intrinsics(lev, mon, best, TRUE, creation);
	/* if couldn't see it but now can, or vice versa, */
	if (!creation && (unseen ^ !canseemon(lev, mon))) {
		if (mon->minvis && !See_invisible) {
			pline("Suddenly you cannot see %s.", nambuf);
			makeknown(best->otyp);
		} /* else if (!mon->minvis) pline("%s suddenly appears!", Amonnam(mon)); */
	}
}